

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utf8.c
# Opt level: O3

_Bool dotest(char *file,int line,char *input,unsigned_long *chars,size_t nchars)

{
  unsigned_long uVar1;
  size_t sVar2;
  _Bool _Var3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  char *local_58;
  char *local_50;
  char *local_48;
  unsigned_long *local_40;
  unsigned_long local_38;
  
  local_58 = input;
  local_40 = chars;
  sVar2 = strlen(input);
  pcVar6 = input + sVar2 + 1;
  uVar5 = 0;
  printf("%s:%d: test start\n",file,line);
  local_48 = pcVar6;
  if (input < pcVar6) {
    uVar5 = 0;
    local_50 = input;
    do {
      pcVar6 = local_50;
      local_38 = decode_utf8(&local_58);
      printf("%s:%d in+%zu out+%zu:",file,(ulong)(uint)line,(long)input - (long)pcVar6,uVar5);
      pcVar6 = local_58;
      if (input < local_58) {
        lVar7 = (long)local_58 - (long)input;
        lVar4 = 0;
        do {
          printf(" %02x",(ulong)(byte)input[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar7 != lVar4);
      }
      uVar1 = local_38;
      printf(" -> U-%08lx\n",local_38);
      if (uVar5 == nchars) {
        pcVar6 = "%s:%d: FAIL: expected no further output\n";
        goto LAB_0010139f;
      }
      if (local_40[uVar5] != uVar1) {
        printf("%s:%d: FAIL: expected U-%08lx\n",file,(ulong)(uint)line);
        return false;
      }
      uVar5 = uVar5 + 1;
      input = pcVar6;
    } while (pcVar6 < local_48);
  }
  if (uVar5 < nchars) {
    pcVar6 = "%s:%d: FAIL: expected further output\n";
LAB_0010139f:
    _Var3 = false;
    printf(pcVar6,file,(ulong)(uint)line);
  }
  else {
    printf("%s:%d: pass\n",file,(ulong)(uint)line);
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

bool dotest(const char *file, int line, const char *input,
            const unsigned long *chars, size_t nchars)
{
    const char *start = input;
    const char *end = input + strlen(input) + 1;
    size_t noutput = 0;

    printf("%s:%d: test start\n", file, line);

    while (input < end) {
        const char *before = input;
        unsigned long wc = decode_utf8(&input);

        printf("%s:%d in+%"SIZEu" out+%"SIZEu":",
               file, line, (size_t)(before-start), noutput);
        while (before < input)
            printf(" %02x", (unsigned)(unsigned char)(*before++));
        printf(" -> U-%08lx\n", wc);

        if (noutput >= nchars) {
            printf("%s:%d: FAIL: expected no further output\n", file, line);
            return false;
        }

        if (chars[noutput] != wc) {
            printf("%s:%d: FAIL: expected U-%08lx\n",
                   file, line, chars[noutput]);
            return false;
        }

        noutput++;
    }

    if (noutput < nchars) {
        printf("%s:%d: FAIL: expected further output\n", file, line);
        return false;
    }

    printf("%s:%d: pass\n", file, line);
    return true;
}